

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O3

char * ascii_read_one_field(ImportCtx *p)

{
  int iVar1;
  int iVar2;
  int c;
  bool bVar3;
  
  iVar1 = p->cColSep;
  iVar2 = p->cRowSep;
  p->n = 0;
  c = fgetc((FILE *)p->in);
  if ((c == -1) || (seenInterrupt != 0)) {
    p->cTerm = -1;
  }
  else {
    bVar3 = c == iVar2;
    if (c != iVar1 && !bVar3) {
      do {
        import_append_char(p,c);
        c = fgetc((FILE *)p->in);
        bVar3 = c == iVar2;
        if ((c == -1) || (c == iVar1)) break;
      } while (c != iVar2);
    }
    if (bVar3) {
      p->nLine = p->nLine + 1;
    }
    p->cTerm = c;
    if (p->z != (char *)0x0) {
      p->z[p->n] = '\0';
      return p->z;
    }
  }
  return (char *)0x0;
}

Assistant:

static char *SQLITE_CDECL ascii_read_one_field(ImportCtx *p) {
	int c;
	int cSep = p->cColSep;
	int rSep = p->cRowSep;
	p->n = 0;
	c = fgetc(p->in);
	if (c == EOF || seenInterrupt) {
		p->cTerm = EOF;
		return 0;
	}
	while (c != EOF && c != cSep && c != rSep) {
		import_append_char(p, c);
		c = fgetc(p->in);
	}
	if (c == rSep) {
		p->nLine++;
	}
	p->cTerm = c;
	if (p->z)
		p->z[p->n] = 0;
	return p->z;
}